

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack17_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  
  auVar10 = *(undefined1 (*) [16])(in + 1);
  auVar11 = vpmovsxbd_avx2(ZEXT816(0x302020101000008));
  uVar1 = *in;
  auVar5 = vpmovsxbd_avx(ZEXT416(0x1000007));
  uVar2 = in[7];
  uVar3 = in[8];
  auVar9 = vpsllvd_avx2(auVar10,_DAT_00194290);
  auVar9 = vpand_avx(auVar9,_DAT_00194b70);
  *out = uVar1 & 0x1ffff;
  uVar4 = *(ulong *)(in + 5);
  auVar11 = vpermi2d_avx512vl(auVar11,ZEXT1632(auVar10),ZEXT432(uVar1));
  auVar7 = vpsrlvd_avx2(auVar11,_DAT_001918a0);
  auVar13._8_4_ = 0x1ffff;
  auVar13._0_8_ = 0x1ffff0001ffff;
  auVar13._12_4_ = 0x1ffff;
  auVar14._16_4_ = 0x1ffff;
  auVar14._0_16_ = auVar13;
  auVar14._20_4_ = 0x1ffff;
  auVar14._24_4_ = 0x1ffff;
  auVar14._28_4_ = 0x1ffff;
  auVar11 = vpmovzxdq_avx2(auVar9);
  auVar6 = vpor_avx2(auVar7,auVar11);
  auVar11 = vpand_avx2(auVar7,auVar14);
  auVar11 = vpblendd_avx2(auVar6,auVar11,0xaa);
  *(undefined1 (*) [32])(out + 1) = auVar11;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar4;
  auVar9 = vpsllvd_avx2(auVar12,_DAT_001a0cd0);
  auVar8._8_8_ = 0x1ffe00001ff80;
  auVar8._0_8_ = 0x1ffe00001ff80;
  auVar9 = vpandq_avx512vl(auVar9,auVar8);
  auVar10 = vpermi2d_avx512vl(auVar5,auVar12,auVar10);
  auVar5 = vpsrlvd_avx2(auVar10,_DAT_001a0f40);
  auVar10 = vpmovzxdq_avx(auVar9);
  auVar9 = vpor_avx(auVar5,auVar10);
  auVar10 = vpand_avx(auVar5,auVar13);
  auVar10 = vpblendd_avx2(auVar9,auVar10,10);
  *(undefined1 (*) [16])(out + 9) = auVar10;
  out[0xd] = (uint)(uVar4 >> 0x3d) | (uVar2 & 0x3fff) << 3;
  out[0xe] = uVar2 >> 0xe & 0x1ffff;
  out[0xf] = (uVar3 & 0xffff) << 1 | uVar2 >> 0x1f;
  return in + 9;
}

Assistant:

const uint32_t *__fastunpack17_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 2)) << (17 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 17);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 4)) << (17 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 17);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 6)) << (17 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 17);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 8)) << (17 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 17);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 10)) << (17 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 17);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 12)) << (17 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 17);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 14)) << (17 - 14);
  out++;
  *out = ((*in) >> 14) % (1U << 17);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 16)) << (17 - 16);
  out++;

  return in + 1;
}